

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsPacket.cpp
# Opt level: O2

void __thiscall CLPIParser::parseClipInfo(CLPIParser *this,BitStreamReader *reader)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  
  BitStreamReader::skipBits(reader,0x20);
  BitStreamReader::skipBits(reader,0x10);
  uVar2 = BitStreamReader::getBits(reader,8);
  this->clip_stream_type = (uint8_t)uVar2;
  uVar2 = BitStreamReader::getBits(reader,8);
  this->application_type = (uint8_t)uVar2;
  BitStreamReader::skipBits(reader,0x1f);
  bVar1 = BitStreamReader::getBit(reader);
  this->is_ATC_delta = bVar1;
  uVar2 = BitStreamReader::getBits(reader,0x20);
  this->TS_recording_rate = uVar2;
  uVar2 = BitStreamReader::getBits(reader,0x20);
  this->number_of_source_packets = uVar2;
  iVar3 = 0x20;
  while (bVar1 = iVar3 != 0, iVar3 = iVar3 + -1, bVar1) {
    BitStreamReader::skipBits(reader,0x20);
  }
  TS_type_info_block(this,reader);
  return;
}

Assistant:

void CLPIParser::parseClipInfo(BitStreamReader& reader)
{
    reader.skipBits(32);                            // length
    reader.skipBits(16);                            // reserved_for_future_use
    clip_stream_type = reader.getBits<uint8_t>(8);  // 1 - AV stream
    application_type = reader.getBits<uint8_t>(8);  // 1 - Main TS for a main-path of Movie
    reader.skipBits(31);                            // reserved_for_future_use
    is_ATC_delta = reader.getBit();
    TS_recording_rate = reader.getBits(32);         // kbps in bytes/sec
    number_of_source_packets = reader.getBits(32);  // number of TS packets?
    for (int i = 0; i < 32; i++) reader.skipBits(32);
    TS_type_info_block(reader);
}